

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O3

int __thiscall
deqp::egl::anon_unknown_0::PartialUpdateTest::init(PartialUpdateTest *this,EVP_PKEY_CTX *ctx)

{
  Functions *dst;
  pointer pp_Var1;
  NativeDisplay *pNVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  Visibility VVar6;
  int iVar7;
  deUint32 dVar8;
  GLuint GVar9;
  GLenum err;
  Library *egl;
  EGLDisplay pvVar10;
  Library *pLVar11;
  FilterList *this_00;
  EGLConfig pvVar12;
  NativeWindowFactory *pNVar13;
  undefined4 extraout_var;
  EGLSurface pvVar14;
  undefined4 extraout_var_00;
  GLES2Renderer *pGVar15;
  pointer pcVar16;
  ReferenceRenderer *pRVar17;
  NotSupportedError *this_01;
  pointer_____offset_0x10___ *ppuVar18;
  long lVar19;
  size_type __dnew;
  size_type __dnew_1;
  value_type local_150;
  value_type local_130;
  size_type local_110;
  undefined1 local_108 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_78;
  undefined1 local_58 [40];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar10 = eglu::getAndInitDisplay
                      ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                       .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar10;
  pLVar11 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar10 = this->m_eglDisplay;
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (pointer)0x0;
  local_108._16_8_ = (pointer)0x0;
  this_00 = eglu::FilterList::operator<<((FilterList *)local_108,isWindow);
  eglu::FilterList::operator<<(this_00,isES2Renderable);
  pvVar12 = eglu::chooseSingleConfig(pLVar11,pvVar10,(FilterList *)local_108);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  this->m_eglConfig = pvVar12;
  pNVar13 = eglu::selectNativeWindowFactory
                      (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  pvVar10 = this->m_eglDisplay;
  pNVar2 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
           super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
           ptr;
  VVar6 = eglu::parseWindowVisibility
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_108._0_8_ = (pointer)0x1e0000001e0;
  local_108._8_4_ = VVar6;
  iVar7 = (*(pNVar13->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar13,pNVar2,pvVar10,pvVar12,0,local_108);
  this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar7);
  pvVar14 = eglu::createWindowSurface
                      ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                       .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var,iVar7),this->m_eglDisplay,
                       pvVar12,(EGLAttrib *)0x0);
  this->m_eglSurface = pvVar14;
  pvVar12 = this->m_eglConfig;
  pLVar11 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_108._0_8_ = (pointer)0x200003098;
  local_108._8_4_ = 0x3038;
  (**pLVar11->_vptr_Library)(pLVar11,0x30a0);
  iVar7 = (*pLVar11->_vptr_Library[6])(pLVar11,this->m_eglDisplay,pvVar12,0,local_108);
  this->m_eglContext = (EGLContext)CONCAT44(extraout_var_00,iVar7);
  dVar8 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
  eglu::checkError(dVar8,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                   ,0x1bb);
  pvVar14 = this->m_eglSurface;
  if (pvVar14 == (EGLSurface)0x0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              ((TestError *)this_01,(char *)0x0,"m_eglSurface != EGL_NO_SURFACE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
               ,0x1bc);
    ppuVar18 = &tcu::TestError::typeinfo;
  }
  else {
    (*pLVar11->_vptr_Library[0x27])(pLVar11,this->m_eglDisplay,pvVar14,pvVar14,this->m_eglContext);
    dVar8 = (*pLVar11->_vptr_Library[0x1f])(pLVar11);
    eglu::checkError(dVar8,"eglMakeCurrent",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                     ,0x1be);
    dst = &this->m_gl;
    EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,dst,(ApiType)0x2);
    pvVar10 = this->m_eglDisplay;
    pp_Var1 = (pointer)(local_108 + 0x10);
    local_108._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"EGL_EXT_buffer_age","");
    bVar5 = eglu::hasExtension(egl,pvVar10,(string *)local_108);
    this->m_supportBufferAge = bVar5;
    if ((pointer)local_108._0_8_ != pp_Var1) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    pvVar10 = this->m_eglDisplay;
    local_108._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"EGL_KHR_partial_update","")
    ;
    bVar5 = eglu::hasExtension(egl,pvVar10,(string *)local_108);
    if ((pointer)local_108._0_8_ != pp_Var1) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (bVar5) {
      pGVar15 = (GLES2Renderer *)operator_new(0xe0);
      pGVar15->m_gl = dst;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      local_130._M_dataplus._M_p = (pointer)0xa9;
      pcVar16 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_150,(ulong)&local_130);
      _Var3._M_p = local_130._M_dataplus._M_p;
      local_150.field_2._M_allocated_capacity = (size_type)local_130._M_dataplus._M_p;
      local_150._M_dataplus._M_p = pcVar16;
      memcpy(pcVar16,
             "attribute mediump vec2 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}"
             ,0xa9);
      local_150._M_string_length = (size_type)_Var3._M_p;
      pcVar16[_Var3._M_p] = '\0';
      local_110 = 0x4a;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      pcVar16 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)&local_110);
      sVar4 = local_110;
      local_130.field_2._M_allocated_capacity = local_110;
      local_130._M_dataplus._M_p = pcVar16;
      memcpy(pcVar16,
             "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}",0x4a)
      ;
      local_130._M_string_length = sVar4;
      pcVar16[sVar4] = '\0';
      memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_108,0,0xac);
      local_58._0_8_ = (pointer)0x0;
      local_58[8] = 0;
      local_58._9_7_ = 0;
      local_58[0x10] = 0;
      local_58._17_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108,&local_150);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_f0,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,
                        (ulong)(local_150.field_2._M_allocated_capacity + 1));
      }
      glu::ShaderProgram::ShaderProgram(&pGVar15->m_glProgram,dst,(ProgramSources *)local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_78);
      lVar19 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_108 + lVar19));
        lVar19 = lVar19 + -0x18;
      } while (lVar19 != -0x18);
      pGVar15->m_coordLoc = 0xffffffff;
      pGVar15->m_colorLoc = 0xffffffff;
      GVar9 = (*pGVar15->m_gl->getAttribLocation)
                        ((pGVar15->m_glProgram).m_program.m_program,"a_color");
      pGVar15->m_colorLoc = GVar9;
      GVar9 = (*pGVar15->m_gl->getAttribLocation)
                        ((pGVar15->m_glProgram).m_program.m_program,"a_pos");
      pGVar15->m_coordLoc = GVar9;
      err = (*pGVar15->m_gl->getError)();
      glu::checkError(err,"Failed to get attribute locations",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,0xef);
      this->m_gles2Renderer = pGVar15;
      pRVar17 = (ReferenceRenderer *)operator_new(1);
      this->m_refRenderer = pRVar17;
      return (int)pRVar17;
    }
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"EGL_KHR_partial_update is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
               ,0x181);
    ppuVar18 = &tcu::NotSupportedError::typeinfo;
  }
  __cxa_throw(this_01,ppuVar18,tcu::Exception::~Exception);
}

Assistant:

void PartialUpdateTest::init (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	m_eglDisplay		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig			= getEGLConfig(m_eglTestCtx.getLibrary(), m_eglDisplay);

	//create surface and context and make them current
	initEGLSurface(m_eglConfig);
	initEGLContext(m_eglConfig);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	m_supportBufferAge = eglu::hasExtension(egl, m_eglDisplay, "EGL_EXT_buffer_age");

	if (!eglu::hasExtension(egl, m_eglDisplay, "EGL_KHR_partial_update"))
		TCU_THROW(NotSupportedError, "EGL_KHR_partial_update is not supported");

	m_gles2Renderer = new GLES2Renderer(m_gl);
	m_refRenderer   = new ReferenceRenderer();
}